

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O0

shared_ptr<Guild> __thiscall
GuildManager::CreateGuild(GuildManager *this,shared_ptr<Guild_Create> *create,string *description)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  World *this_00;
  Character *joined;
  Character *pCVar3;
  bool bVar4;
  int width;
  mapped_type *pmVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  time_t tVar9;
  undefined8 uVar10;
  element_type *peVar11;
  reference psVar12;
  element_type *peVar13;
  Character *pCVar14;
  element_type *this_01;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  shared_ptr<Guild> sVar16;
  string local_158;
  Character *local_138;
  Character *character;
  shared_ptr<Guild_Member> member;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> *__range2;
  undefined1 local_e2;
  allocator local_e1;
  key_type local_e0;
  string local_c0;
  Database_Result local_a0;
  allocator local_69;
  key_type local_68;
  string local_48;
  string *description_local;
  shared_ptr<Guild_Create> *create_local;
  GuildManager *this_local;
  shared_ptr<Guild> *guild;
  
  p_Var1 = create[7].super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  description_local = description;
  create_local = create;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"GuildMaxWidth",&local_69);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)&p_Var1[0x19]._M_use_count,&local_68);
  width = util::variant::operator_cast_to_int(pmVar5);
  util::text_word_wrap(&local_48,in_RCX,width);
  std::__cxx11::string::operator=((string *)in_RCX,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  p_Var1 = create[7].super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             description);
  uVar6 = std::__cxx11::string::c_str();
  std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             description);
  uVar7 = std::__cxx11::string::c_str();
  uVar8 = std::__cxx11::string::c_str();
  tVar9 = time((time_t *)0x0);
  p_Var2 = create[7].super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"GuildDefaultRanks",&local_e1);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)&p_Var2[0x19]._M_use_count,&local_e0);
  util::variant::operator_cast_to_string(&local_c0,pmVar5);
  uVar10 = std::__cxx11::string::c_str();
  Database::Query(&local_a0,(Database *)&p_Var1[8]._M_use_count,
                  "INSERT INTO `guilds` (`tag`, `name`, `description`, `created`, `ranks`) VALUES (\'$\', \'$\', \'$\', #, \'$\')"
                  ,uVar6,uVar7,uVar8,(int)tVar9,uVar10);
  Database_Result::~Database_Result(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  peVar11 = std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)description);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>_>
  ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>_>
           *)(create + 4),&peVar11->tag);
  local_e2 = 0;
  peVar11 = std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)description);
  std::__cxx11::string::string((string *)&__range2,(string *)&peVar11->tag);
  GetGuild(this,(string *)create);
  std::__cxx11::string::~string((string *)&__range2);
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  _Var15._M_pi = extraout_RDX;
  if (bVar4) {
    peVar11 = std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)description);
    __end2 = std::
             vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
             ::begin(&peVar11->members);
    member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
         ::end(&peVar11->members);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
                                       *)&member.
                                          super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount), bVar4) {
      psVar12 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
                ::operator*(&__end2);
      std::shared_ptr<Guild_Member>::shared_ptr((shared_ptr<Guild_Member> *)&character,psVar12);
      this_00 = (World *)create[7].super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
      peVar13 = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&character);
      std::__cxx11::string::string((string *)&local_158,(string *)peVar13);
      pCVar14 = World::GetCharacterReal(this_00,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      local_138 = pCVar14;
      if (pCVar14 != (Character *)0x0) {
        this_01 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )this);
        joined = local_138;
        peVar11 = std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)description);
        pCVar3 = local_138;
        pCVar14 = peVar11->leader;
        peVar11 = std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)description);
        bVar4 = pCVar3 != peVar11->leader;
        Guild::AddMember(this_01,joined,pCVar14,false,(uint)bVar4 + (uint)bVar4 * 8);
      }
      std::shared_ptr<Guild_Member>::~shared_ptr((shared_ptr<Guild_Member> *)&character);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
      ::operator++(&__end2);
    }
    peVar11 = std::__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Guild_Create,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)description);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>_>
    ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>_>
             *)(create + 4),&peVar11->tag);
    _Var15._M_pi = extraout_RDX_00;
  }
  sVar16.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var15._M_pi;
  sVar16.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Guild>)sVar16.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Guild> GuildManager::CreateGuild(std::shared_ptr<Guild_Create> create, std::string description)
{
	description = util::text_word_wrap(description, this->world->config["GuildMaxWidth"]);

	this->world->db.Query("INSERT INTO `guilds` (`tag`, `name`, `description`, `created`, `ranks`) VALUES ('$', '$', '$', #, '$')", create->tag.c_str(), create->name.c_str(), description.c_str(), int(std::time(0)), static_cast<std::string>(this->world->config["GuildDefaultRanks"]).c_str());

	this->create_cache.erase(create->tag);

	std::shared_ptr<Guild> guild = this->GetGuild(create->tag);

	if (guild)
	{
		UTIL_FOREACH(create->members, member)
		{
			Character *character = this->world->GetCharacterReal(member->name);

			if (character)
			{
				guild->AddMember(character, create->leader, false, (character == create->leader) ? 0 : 9);
			}
		}

		this->create_cache.erase(create->tag);
	}

	return guild;
}